

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall pybind11::error_already_set::error_already_set(error_already_set *this)

{
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  detail::error_string_abi_cxx11_();
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  *(undefined ***)this = &PTR__error_already_set_00133ae0;
  (this->type).super_handle.m_ptr = (PyObject *)0x0;
  (this->value).super_handle.m_ptr = (PyObject *)0x0;
  (this->trace).super_handle.m_ptr = (PyObject *)0x0;
  PyErr_Fetch(&this->type,&this->value,&this->trace);
  return;
}

Assistant:

error_already_set() : std::runtime_error(detail::error_string()) {
        PyErr_Fetch(&type.ptr(), &value.ptr(), &trace.ptr());
    }